

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O3

Gia_Man_t *
Bmc_BmciPart(Gia_Man_t *pNew,Vec_Int_t *vSatMap,Vec_Int_t *vMiters,Vec_Int_t *vPartMap,
            Vec_Int_t *vCopies)

{
  int iVar1;
  char *__s;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  Gia_Man_t *pPart;
  size_t sVar8;
  char *__dest;
  Gia_Obj_t *pFanout;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  
  uVar4 = pNew->nObjs;
  if (vCopies->nCap < (int)uVar4) {
    if (vCopies->pArray == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar4 << 2);
    }
    else {
      piVar7 = (int *)realloc(vCopies->pArray,(long)(int)uVar4 << 2);
    }
    vCopies->pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_00547977;
    vCopies->nCap = uVar4;
  }
  if (0 < (int)uVar4) {
    memset(vCopies->pArray,0,(ulong)uVar4 * 4);
  }
  vCopies->nSize = uVar4;
  iVar5 = pNew->nObjs;
  uVar4 = vSatMap->nSize;
  if (iVar5 <= (int)uVar4) goto LAB_0054763b;
  iVar1 = vSatMap->nCap;
  iVar10 = iVar1 * 2;
  if (iVar10 < iVar5) {
    if (iVar1 < iVar5) {
      if (vSatMap->pArray == (int *)0x0) {
        piVar7 = (int *)malloc((long)iVar5 << 2);
      }
      else {
        piVar7 = (int *)realloc(vSatMap->pArray,(long)iVar5 << 2);
      }
      vSatMap->pArray = piVar7;
      iVar10 = iVar5;
LAB_00547601:
      if (piVar7 == (int *)0x0) {
LAB_00547977:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      vSatMap->nCap = iVar10;
      uVar4 = vSatMap->nSize;
    }
  }
  else if (iVar1 < iVar5) {
    if (vSatMap->pArray == (int *)0x0) {
      piVar7 = (int *)malloc((long)iVar1 << 3);
    }
    else {
      piVar7 = (int *)realloc(vSatMap->pArray,(long)iVar1 << 3);
    }
    vSatMap->pArray = piVar7;
    goto LAB_00547601;
  }
  if ((int)uVar4 < iVar5) {
    memset(vSatMap->pArray + (int)uVar4,0xff,(ulong)(~uVar4 + iVar5) * 4 + 4);
  }
  vSatMap->nSize = iVar5;
LAB_0054763b:
  pPart = Gia_ManStart(1000);
  __s = pNew->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar8 = strlen(__s);
    __dest = (char *)malloc(sVar8 + 1);
    strcpy(__dest,__s);
  }
  pPart->pName = __dest;
  vPartMap->nSize = 0;
  Vec_IntPush(vPartMap,0);
  iVar5 = vMiters->nSize;
  if (0 < iVar5) {
    lVar12 = 0;
    do {
      uVar4 = vMiters->pArray[lVar12];
      if (uVar4 != 0xffffffff) {
        if ((int)uVar4 < 2) {
          __assert_fail("iLit >= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmci.c"
                        ,0x9b,
                        "Gia_Man_t *Bmc_BmciPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        uVar6 = Bmc_BmciPart_rec(pNew,vSatMap,uVar4 >> 1,pPart,vPartMap,vCopies);
        if ((int)uVar6 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar13 = uVar6 >> 1;
        if (pPart->nObjs <= (int)uVar13) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x30e,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        if ((~*(uint *)(pPart->pObjs + uVar13) & 0x1fffffff) != 0 &&
            (int)*(uint *)(pPart->pObjs + uVar13) < 0) {
          __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x30f,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        pFanout = Gia_ManAppendObj(pPart);
        uVar2 = *(ulong *)pFanout;
        *(ulong *)pFanout = uVar2 | 0x80000000;
        pGVar3 = pPart->pObjs;
        if ((pFanout < pGVar3) || (pGVar3 + pPart->nObjs <= pFanout)) {
LAB_0054789e:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar9 = (ulong)(((uint)((int)pFanout - (int)pGVar3) >> 2) * -0x55555555 - uVar13 &
                       0x1fffffff);
        uVar11 = (ulong)(((uVar6 ^ uVar4) & 1) << 0x1d);
        *(ulong *)pFanout = uVar11 | uVar2 & 0xffffffffc0000000 | 0x80000000 | uVar9;
        *(ulong *)pFanout =
             uVar11 | uVar2 & 0xe0000000c0000000 | 0x80000000 | uVar9 |
             (ulong)(pPart->vCos->nSize & 0x1fffffff) << 0x20;
        pGVar3 = pPart->pObjs;
        if ((pFanout < pGVar3) || (pGVar3 + pPart->nObjs <= pFanout)) goto LAB_0054789e;
        Vec_IntPush(pPart->vCos,(int)((ulong)((long)pFanout - (long)pGVar3) >> 2) * -0x55555555);
        if (pPart->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(pPart,pFanout + -(ulong)((uint)*(undefined8 *)pFanout & 0x1fffffff),
                           pFanout);
        }
        if ((pFanout < pPart->pObjs) || (pPart->pObjs + pPart->nObjs <= pFanout)) goto LAB_0054789e;
        Vec_IntPush(vPartMap,-1);
        iVar5 = vMiters->nSize;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar5);
  }
  if (pPart->vCos->nSize <= pPart->nRegs) {
    __assert_fail("Gia_ManPoNum(pPart) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmci.c"
                  ,0xa0,
                  "Gia_Man_t *Bmc_BmciPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if (vPartMap->nSize == pPart->nObjs) {
    return pPart;
  }
  __assert_fail("Vec_IntSize(vPartMap) == Gia_ManObjNum(pPart)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmci.c"
                ,0xa1,
                "Gia_Man_t *Bmc_BmciPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

Gia_Man_t * Bmc_BmciPart( Gia_Man_t * pNew, Vec_Int_t * vSatMap, Vec_Int_t * vMiters, Vec_Int_t * vPartMap, Vec_Int_t * vCopies )
{
    Gia_Man_t * pPart;
    int i, iLit, iLitPart;
    Vec_IntFill( vCopies, Gia_ManObjNum(pNew), 0 );
    Vec_IntFillExtra( vSatMap, Gia_ManObjNum(pNew), -1 );
    pPart = Gia_ManStart( 1000 );
    pPart->pName = Abc_UtilStrsav( pNew->pName );
    Vec_IntClear( vPartMap );
    Vec_IntPush( vPartMap, 0 );
    Vec_IntForEachEntry( vMiters, iLit, i )
    {
        if ( iLit == -1 )
            continue;
        assert( iLit >= 2 );
        iLitPart = Bmc_BmciPart_rec( pNew, vSatMap, Abc_Lit2Var(iLit), pPart, vPartMap, vCopies );
        Gia_ManAppendCo( pPart, Abc_LitNotCond(iLitPart, Abc_LitIsCompl(iLit)) );
        Vec_IntPush( vPartMap, -1 );
    }
    assert( Gia_ManPoNum(pPart) > 0 );
    assert( Vec_IntSize(vPartMap) == Gia_ManObjNum(pPart) );
    return pPart;
}